

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_three_reg_same_fp16(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  bool bVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t srcidx;
  uint32_t srcidx_00;
  uint32_t srcidx_01;
  uint uVar7;
  uint uVar8;
  uint element;
  TCGv_ptr arg3;
  TCGv_i32 pTVar9;
  TCGv_i32 pTVar10;
  TCGv_i32 pTVar11;
  uint32_t local_ec;
  TCGv_i32 tcg_res_1;
  TCGv_i32 tcg_op2_1;
  TCGv_i32 tcg_op1_1;
  int passelt;
  int passreg;
  TCGv_i32 tcg_res [8];
  TCGv_i32 tcg_op2;
  TCGv_i32 tcg_op1;
  int maxpass;
  _Bool pairwise;
  TCGv_ptr fpst;
  int pass;
  int elements;
  int datasize;
  int rd;
  int rn;
  int rm;
  int a;
  int u;
  int is_q;
  int fpopcode;
  int opcode;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar1 = false;
  _Var2 = isar_feature_aa64_fp16(s->isar);
  if (_Var2) {
    _Var2 = fp_access_check(s);
    if (_Var2) {
      uVar3 = extract32(insn,0xb,3);
      uVar4 = extract32(insn,0x1d,1);
      uVar5 = extract32(insn,0x17,1);
      uVar6 = extract32(insn,0x1e,1);
      srcidx = extract32(insn,0x10,5);
      srcidx_00 = extract32(insn,5,5);
      srcidx_01 = extract32(insn,0,5);
      uVar7 = uVar3 | uVar5 << 3 | uVar4 << 4;
      if ((((uVar7 == 0x10) || (uVar7 == 0x12)) || (uVar7 == 0x16)) ||
         ((uVar7 == 0x18 || (uVar7 == 0x1e)))) {
        bVar1 = true;
      }
      arg3 = get_fpstatus_ptr_aarch64(tcg_ctx_00,true);
      if (bVar1) {
        uVar8 = 4;
        if (uVar6 != 0) {
          uVar8 = 8;
        }
        pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
        pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
        for (fpst._4_4_ = 0; fpst._4_4_ < (int)uVar8; fpst._4_4_ = fpst._4_4_ + 1) {
          local_ec = srcidx;
          if (fpst._4_4_ < (int)(uVar8 / 2)) {
            local_ec = srcidx_00;
          }
          element = fpst._4_4_ * 2 & uVar8 - 1;
          read_vec_element_i32(s,pTVar9,local_ec,element,MO_16);
          read_vec_element_i32(s,pTVar10,local_ec,element + 1,MO_16);
          pTVar11 = tcg_temp_new_i32(tcg_ctx_00);
          *(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2) = pTVar11;
          if (0xd < uVar7 - 0x10 && uVar7 != 0x1e) {
LAB_00837606:
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2e6e,(char *)0x0);
          }
          switch((long)&switchD_0083754d::switchdataD_0137c1f4 +
                 (long)(int)(&switchD_0083754d::switchdataD_0137c1f4)[uVar7 - 0x10]) {
          case 0x83754f:
            gen_helper_advsimd_maxnumh
                      (tcg_ctx_00,*(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2),pTVar9,pTVar10,arg3
                      );
            break;
          case 0x837575:
            gen_helper_advsimd_addh
                      (tcg_ctx_00,*(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2),pTVar9,pTVar10,arg3
                      );
            break;
          case 0x83759b:
            gen_helper_advsimd_maxh
                      (tcg_ctx_00,*(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2),pTVar9,pTVar10,arg3
                      );
            break;
          case 0x8375be:
            gen_helper_advsimd_minnumh
                      (tcg_ctx_00,*(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2),pTVar9,pTVar10,arg3
                      );
            break;
          case 0x8375e1:
            gen_helper_advsimd_minh
                      (tcg_ctx_00,*(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2),pTVar9,pTVar10,arg3
                      );
            break;
          case 0x837604:
            goto LAB_00837606;
          }
        }
        for (fpst._4_4_ = 0; fpst._4_4_ < (int)uVar8; fpst._4_4_ = fpst._4_4_ + 1) {
          write_vec_element_i32
                    (s,*(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2),srcidx_01,fpst._4_4_,MO_16);
          tcg_temp_free_i32(tcg_ctx_00,*(TCGv_i32 *)(&passelt + (long)fpst._4_4_ * 2));
        }
        tcg_temp_free_i32(tcg_ctx_00,pTVar9);
        tcg_temp_free_i32(tcg_ctx_00,pTVar10);
      }
      else {
        for (fpst._4_4_ = 0; fpst._4_4_ < (int)((uint)(uVar6 != 0) * 0x40 + 0x40) >> 4;
            fpst._4_4_ = fpst._4_4_ + 1) {
          pTVar9 = tcg_temp_new_i32(tcg_ctx_00);
          pTVar10 = tcg_temp_new_i32(tcg_ctx_00);
          pTVar11 = tcg_temp_new_i32(tcg_ctx_00);
          read_vec_element_i32(s,pTVar9,srcidx_00,fpst._4_4_,MO_16);
          read_vec_element_i32(s,pTVar10,srcidx,fpst._4_4_,MO_16);
          switch(uVar7) {
          case 0:
            gen_helper_advsimd_maxnumh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 1:
            read_vec_element_i32(s,pTVar11,srcidx_01,fpst._4_4_,MO_16);
            gen_helper_advsimd_muladdh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,pTVar11,arg3);
            break;
          case 2:
            gen_helper_advsimd_addh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 3:
            gen_helper_advsimd_mulxh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 4:
            gen_helper_advsimd_ceq_f16(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          default:
            fprintf(_stderr,"%s: insn %#04x, fpop %#2x @ %#lx\n","disas_simd_three_reg_same_fp16",
                    (ulong)insn,(ulong)uVar7,s->pc_curr);
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,0x2ec7,(char *)0x0);
          case 6:
            gen_helper_advsimd_maxh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 7:
            gen_helper_recpsf_f16(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 8:
            gen_helper_advsimd_minnumh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 9:
            tcg_gen_xori_i32_aarch64(tcg_ctx_00,pTVar9,pTVar9,0x8000);
            read_vec_element_i32(s,pTVar11,srcidx_01,fpst._4_4_,MO_16);
            gen_helper_advsimd_muladdh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,pTVar11,arg3);
            break;
          case 10:
            gen_helper_advsimd_subh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0xe:
            gen_helper_advsimd_minh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0xf:
            gen_helper_rsqrtsf_f16(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0x13:
            gen_helper_advsimd_mulh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0x14:
            gen_helper_advsimd_cge_f16(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0x15:
            gen_helper_advsimd_acge_f16(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0x17:
            gen_helper_advsimd_divh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0x1a:
            gen_helper_advsimd_subh(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            tcg_gen_andi_i32_aarch64(tcg_ctx_00,pTVar11,pTVar11,0x7fff);
            break;
          case 0x1c:
            gen_helper_advsimd_cgt_f16(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
            break;
          case 0x1d:
            gen_helper_advsimd_acgt_f16(tcg_ctx_00,pTVar11,pTVar9,pTVar10,arg3);
          }
          write_vec_element_i32(s,pTVar11,srcidx_01,fpst._4_4_,MO_16);
          tcg_temp_free_i32(tcg_ctx_00,pTVar11);
          tcg_temp_free_i32(tcg_ctx_00,pTVar9);
          tcg_temp_free_i32(tcg_ctx_00,pTVar10);
        }
      }
      tcg_temp_free_ptr(tcg_ctx_00,arg3);
      clear_vec_high(s,uVar6 != 0,srcidx_01);
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_simd_three_reg_same_fp16(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode, fpopcode;
    int is_q, u, a, rm, rn, rd;
    int datasize, elements;
    int pass;
    TCGv_ptr fpst;
    bool pairwise = false;

    if (!dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* For these floating point ops, the U, a and opcode bits
     * together indicate the operation.
     */
    opcode = extract32(insn, 11, 3);
    u = extract32(insn, 29, 1);
    a = extract32(insn, 23, 1);
    is_q = extract32(insn, 30, 1);
    rm = extract32(insn, 16, 5);
    rn = extract32(insn, 5, 5);
    rd = extract32(insn, 0, 5);

    fpopcode = opcode | (a << 3) |  (u << 4);
    datasize = is_q ? 128 : 64;
    elements = datasize / 16;

    switch (fpopcode) {
    case 0x10: /* FMAXNMP */
    case 0x12: /* FADDP */
    case 0x16: /* FMAXP */
    case 0x18: /* FMINNMP */
    case 0x1e: /* FMINP */
        pairwise = true;
        break;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, true);

    if (pairwise) {
        int maxpass = is_q ? 8 : 4;
        TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res[8];

        for (pass = 0; pass < maxpass; pass++) {
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (pass << 1) & (maxpass - 1);

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_16);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_16);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (fpopcode) {
            case 0x10: /* FMAXNMP */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x12: /* FADDP */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x16: /* FMAXP */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x18: /* FMINNMP */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x1e: /* FMINP */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_op1);
        tcg_temp_free_i32(tcg_ctx, tcg_op2);

    } else {
        for (pass = 0; pass < elements; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op1, rn, pass, MO_16);
            read_vec_element_i32(s, tcg_op2, rm, pass, MO_16);

            switch (fpopcode) {
            case 0x0: /* FMAXNM */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0x2: /* FADD */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x3: /* FMULX */
                gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x4: /* FCMEQ */
                gen_helper_advsimd_ceq_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x6: /* FMAX */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x7: /* FRECPS */
                gen_helper_recpsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x8: /* FMINNM */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x9: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                tcg_gen_xori_i32(tcg_ctx, tcg_op1, tcg_op1, 0x8000);
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0xa: /* FSUB */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xe: /* FMIN */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xf: /* FRSQRTS */
                gen_helper_rsqrtsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x13: /* FMUL */
                gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x14: /* FCMGE */
                gen_helper_advsimd_cge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x15: /* FACGE */
                gen_helper_advsimd_acge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x17: /* FDIV */
                gen_helper_advsimd_divh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1a: /* FABD */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                tcg_gen_andi_i32(tcg_ctx, tcg_res, tcg_res, 0x7fff);
                break;
            case 0x1c: /* FCMGT */
                gen_helper_advsimd_cgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1d: /* FACGT */
                gen_helper_advsimd_acgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            default:
                fprintf(stderr, "%s: insn %#04x, fpop %#2x @ %#" PRIx64 "\n",
                        __func__, insn, fpopcode, s->pc_curr);
                g_assert_not_reached();
            }

            write_vec_element_i32(s, tcg_res, rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }
    }

    tcg_temp_free_ptr(tcg_ctx, fpst);

    clear_vec_high(s, is_q, rd);
}